

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ToastOverlay::RecalculateSize(ToastOverlay *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  wstring local_40;
  
  f8n::utf::u8to16(&local_40,&this->title);
  iVar1 = wcswidth(local_40._M_dataplus._M_p,local_40._M_string_length);
  if (iVar1 < 1) {
    iVar1 = (int)(this->title)._M_string_length;
  }
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  iVar2 = Screen::GetWidth();
  iVar3 = (iVar2 << 2) / 5;
  iVar2 = iVar1 + 4;
  if (iVar3 < iVar1 + 4) {
    iVar2 = iVar3;
  }
  this->width = iVar2;
  text::BreakLines((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_40,&this->title,(long)(iVar2 + -4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->titleLines,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_40);
  iVar3 = (int)((ulong)((long)(this->titleLines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->titleLines).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + 2;
  iVar2 = Screen::GetHeight();
  iVar1 = iVar2 + -4;
  if (iVar3 <= iVar2 + -4) {
    iVar1 = iVar3;
  }
  this->height = iVar1;
  iVar1 = Screen::GetWidth();
  this->x = this->width / -2 + iVar1 / 2;
  this->y = 2;
  return;
}

Assistant:

void ToastOverlay::RecalculateSize() {
    int cols = (int) u8cols(this->title);
    this->width = std::min(cols + 4, (Screen::GetWidth() * 4) / 5);
    this->titleLines = text::BreakLines(this->title, this->width - 4);
    this->height = std::min((int) this->titleLines.size() + 2, Screen::GetHeight() - 4);
    this->x = (Screen::GetWidth() / 2) - (this->width / 2);
    this->y = 2;
}